

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequencer.c
# Opt level: O3

void lws_sul_seq_heartbeat_cb(lws_sorted_usec_list_t *sul)

{
  lws_seq_t *plVar1;
  lws_seq_t *seq;
  
  seq = (lws_seq_t *)sul[-2].list.owner;
  while (seq != (lws_seq_t *)0x0) {
    plVar1 = (lws_seq_t *)(seq->seq_list).next;
    lws_seq_queue_event(seq,LWSSEQ_HEARTBEAT,(void *)0x0,(void *)0x0);
    seq = plVar1;
  }
  __lws_sul_insert((lws_dll2_owner_t *)&sul[-1].list.owner,sul,1000000);
  return;
}

Assistant:

static void
lws_sul_seq_heartbeat_cb(lws_sorted_usec_list_t *sul)
{
	struct lws_context_per_thread *pt = lws_container_of(sul,
			struct lws_context_per_thread, sul_seq_heartbeat);

	/* send every sequencer a heartbeat message... it can ignore it */

	lws_start_foreach_dll_safe(struct lws_dll2 *, p, tp,
				   lws_dll2_get_head(&pt->seq_owner)) {
		lws_seq_t *s = lws_container_of(p, lws_seq_t, seq_list);

		/* queue the message to inform the sequencer */
		lws_seq_queue_event(s, LWSSEQ_HEARTBEAT, NULL, NULL);

	} lws_end_foreach_dll_safe(p, tp);

	/* schedule the next one */

	__lws_sul_insert(&pt->pt_sul_owner, &pt->sul_seq_heartbeat,
			 LWS_US_PER_SEC);
}